

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool TextKeyTest<Blob<160>>
               (hashfunc<Blob<160>_> hash,char *prefix,char *coreset,int corelen,char *suffix,
               bool drawDiagram)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *__dest;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  
  sVar3 = strlen(prefix);
  sVar4 = strlen(suffix);
  sVar5 = strlen(coreset);
  iVar11 = (int)sVar5;
  iVar13 = (int)sVar3;
  dVar15 = pow((double)iVar11,(double)corelen);
  printf("Keyset \'Text\' - keys of form \"%s[",prefix);
  uVar9 = ~(corelen >> 0x1f) & corelen;
  uVar10 = uVar9;
  while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
    putchar(0x58);
  }
  uVar10 = (uint)dVar15;
  iVar2 = (int)sVar4;
  iVar8 = iVar13 + corelen + iVar2;
  printf("]%s\" - %d keys\n",suffix);
  iVar6 = -1;
  if (-2 < iVar8) {
    iVar6 = iVar13 + corelen + 1 + iVar2;
  }
  __dest = operator_new__((long)iVar6);
  *(undefined1 *)((long)__dest + (long)iVar8) = 0;
  memcpy(__dest,prefix,(long)iVar13);
  memcpy((void *)((long)corelen + (long)iVar13 + (long)__dest),suffix,(long)iVar2);
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&hashes,(long)(int)uVar10);
  for (uVar12 = 0; uVar12 != (~((int)uVar10 >> 0x1f) & uVar10); uVar12 = uVar12 + 1) {
    uVar1 = uVar12;
    for (uVar7 = 0; iVar2 = (int)uVar1, uVar9 != uVar7; uVar7 = uVar7 + 1) {
      uVar1 = (long)iVar2 / (long)iVar11;
      *(char *)((long)__dest + uVar7 + (long)iVar13) = coreset[iVar2 % iVar11];
    }
    (*hash.m_hash)(__dest,iVar8,0,
                   hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12);
  }
  bVar14 = TestHashList<Blob<160>>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  operator_delete__(__dest);
  std::_Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>);
  return bVar14;
}

Assistant:

bool TextKeyTest ( hashfunc<hashtype> hash, const char * prefix, const char * coreset, const int corelen, const char * suffix, bool drawDiagram )
{
  const int prefixlen = (int)strlen(prefix);
  const int suffixlen = (int)strlen(suffix);
  const int corecount = (int)strlen(coreset);

  const int keybytes = prefixlen + corelen + suffixlen;
  const int keycount = (int)pow(double(corecount),double(corelen));

  printf("Keyset 'Text' - keys of form \"%s[",prefix);
  for(int i = 0; i < corelen; i++) printf("X");
  printf("]%s\" - %d keys\n",suffix,keycount);

  uint8_t * key = new uint8_t[keybytes+1];

  key[keybytes] = 0;

  memcpy(key,prefix,prefixlen);
  memcpy(key+prefixlen+corelen,suffix,suffixlen);

  //----------

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    int t = i;

    for(int j = 0; j < corelen; j++)
    {
      key[prefixlen+j] = coreset[t % corecount]; t /= corecount;
    }

    hash(key,keybytes,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] key;

  return result;
}